

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_copy(int nargs,char **args)

{
  int iVar1;
  ssize_t sVar2;
  long in_RSI;
  int in_EDI;
  char *p;
  int brtr;
  int brtw;
  stat info;
  int fd2;
  int fd1;
  int rc;
  char *buffer;
  void *local_c8;
  int local_c0;
  int local_bc;
  stat local_b8;
  int local_24;
  int local_20;
  int local_1c;
  void *local_18;
  long local_10;
  int local_4;
  
  local_18 = (void *)0x0;
  local_1c = 0;
  local_20 = 0xffffffff;
  local_24 = -1;
  if (in_EDI == 3) {
    local_10 = in_RSI;
    iVar1 = stat(*(char **)(in_RSI + 8),&local_b8);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      local_20 = open(*(char **)(local_10 + 8),0);
      if (((local_20 < 0) ||
          (local_24 = open(*(char **)(local_10 + 0x10),0x241,0x1b0), local_24 < 0)) ||
         (local_c8 = malloc(local_b8.st_size), local_18 = local_c8, local_c8 == (void *)0x0)) {
LAB_00105699:
        local_1c = -1;
      }
      else {
        for (local_c0 = (int)local_b8.st_size; local_c0 != 0; local_c0 = local_c0 - local_1c) {
          sVar2 = read(local_20,local_c8,(long)local_c0);
          local_1c = (int)sVar2;
          if (local_1c < 0) goto LAB_00105699;
          if (local_1c == 0) break;
          local_c8 = (void *)((long)local_c8 + (long)local_1c);
        }
        local_c8 = local_18;
        for (local_bc = (int)local_b8.st_size; local_bc != 0; local_bc = local_bc - local_1c) {
          sVar2 = write(local_24,local_c8,(long)local_bc);
          local_1c = (int)sVar2;
          if (local_1c < 0) goto LAB_00105699;
          if (local_1c == 0) break;
          local_c8 = (void *)((long)local_c8 + (long)local_1c);
        }
        local_1c = 0;
      }
      if (local_18 != (void *)0x0) {
        free(local_18);
      }
      if (-1 < local_20) {
        close(local_20);
      }
      if (-1 < local_24) {
        close(local_24);
      }
      local_4 = local_1c;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int do_copy(int nargs, char **args)
{
    char *buffer = NULL;
    int rc = 0;
    int fd1 = -1, fd2 = -1;
    struct stat info;
    int brtw, brtr;
    char *p;

    if (nargs != 3)
        return -1;

    if (stat(args[1], &info) < 0) 
        return -1;

    if ((fd1 = open(args[1], O_RDONLY)) < 0) 
        goto out_err;

    if ((fd2 = open(args[2], O_WRONLY|O_CREAT|O_TRUNC, 0660)) < 0)
        goto out_err;

    if (!(buffer = malloc(info.st_size)))
        goto out_err;

    p = buffer;
    brtr = info.st_size;
    while(brtr) {
        rc = read(fd1, p, brtr);
        if (rc < 0)
            goto out_err;
        if (rc == 0)
            break;
        p += rc;
        brtr -= rc;
    }

    p = buffer;
    brtw = info.st_size;
    while(brtw) {
        rc = write(fd2, p, brtw);
        if (rc < 0)
            goto out_err;
        if (rc == 0)
            break;
        p += rc;
        brtw -= rc;
    }

    rc = 0;
    goto out;
out_err:
    rc = -1;
out:
    if (buffer)
        free(buffer);
    if (fd1 >= 0)
        close(fd1);
    if (fd2 >= 0)
        close(fd2);
    return rc;
}